

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_CoalescedMSFStream.cpp
# Opt level: O3

void __thiscall
PDB::CoalescedMSFStream::CoalescedMSFStream
          (CoalescedMSFStream *this,void *data,uint32_t blockSize,uint32_t *blockIndices,
          uint32_t streamSize)

{
  Byte *__dest;
  ulong uVar1;
  anon_union_8_3_06f60122 anon_var_0;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)blockSize;
  this->m_ownedData = (Byte *)0x0;
  this->m_data = (Byte *)0x0;
  this->m_size = (ulong)streamSize;
  uVar2 = ((blockSize + streamSize) - 1) / uVar3;
  if (1 < (uint)uVar2) {
    uVar1 = 1;
    do {
      if (*blockIndices + (int)uVar1 != blockIndices[uVar1]) {
        __dest = (Byte *)operator_new__((ulong)streamSize);
        this->m_ownedData = __dest;
        this->m_data = __dest;
        uVar3 = streamSize / uVar3;
        uVar2 = (ulong)blockSize;
        if (blockSize <= streamSize) {
          uVar1 = 0;
          do {
            memcpy(__dest,(void *)(blockIndices[uVar1] * uVar2 + (long)data),uVar2);
            __dest = __dest + uVar2;
            uVar1 = uVar1 + 1;
          } while (uVar1 < uVar3);
        }
        if ((int)uVar3 * blockSize == streamSize) {
          return;
        }
        memcpy(__dest,(void *)((long)data + uVar2 * blockIndices[uVar3]),
               (ulong)(streamSize % blockSize));
        return;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < uVar2);
  }
  this->m_data = (Byte *)((long)data + *blockIndices * uVar3);
  return;
}

Assistant:

PDB::CoalescedMSFStream::CoalescedMSFStream(const void* data, uint32_t blockSize, const uint32_t* blockIndices, uint32_t streamSize) PDB_NO_EXCEPT
	: m_ownedData(nullptr)
	, m_data(nullptr)
	, m_size(streamSize)
{
	if (AreBlockIndicesContiguous(blockIndices, blockSize, streamSize))
	{
		// fast path, all block indices are contiguous, so we don't have to copy any data at all.
		// instead, we directly point into the memory-mapped file at the correct offset.
		const uint32_t index = blockIndices[0];
		const size_t fileOffset = PDB::ConvertBlockIndexToFileOffset(index, blockSize);
		m_data = Pointer::Offset<const Byte*>(data, fileOffset);
	}
	else
	{
		// slower path, we need to copy disjunct blocks into our own data array, block by block
		m_ownedData = PDB_NEW_ARRAY(Byte, streamSize);
		m_data = m_ownedData;

		Byte* destination = m_ownedData;

		// copy full blocks first
		const uint32_t fullBlockCount = streamSize / blockSize;
		for (uint32_t i = 0u; i < fullBlockCount; ++i)
		{
			const uint32_t index = blockIndices[i];

			// read one single block at the correct offset in the stream
			const size_t fileOffset = PDB::ConvertBlockIndexToFileOffset(index, blockSize);
			const void* sourceData = Pointer::Offset<const void*>(data, fileOffset);
			std::memcpy(destination, sourceData, blockSize);

			destination += blockSize;
		}

		// account for non-full blocks
		const uint32_t remainingBytes = streamSize - (fullBlockCount * blockSize);
		if (remainingBytes != 0u)
		{
			const uint32_t index = blockIndices[fullBlockCount];

			// read remaining bytes at correct offset in the stream
			const size_t fileOffset = PDB::ConvertBlockIndexToFileOffset(index, blockSize);
			const void* sourceData = Pointer::Offset<const void*>(data, fileOffset);
			std::memcpy(destination, sourceData, remainingBytes);
		}
	}
}